

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URResolution.cpp
# Opt level: O3

void __thiscall
Inferences::URResolution::Item::Item
          (Item *this,Clause *cl,bool selectedOnly,URResolution *parent,bool mustResolveAll)

{
  int iVar1;
  Literal *pLVar2;
  Clause **ppCVar3;
  Literal **ppLVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  ulong s;
  uint uVar9;
  bool bVar10;
  
  this->_orig = cl;
  uVar6 = (uint)*(undefined8 *)&cl->field_0x38;
  if ((~uVar6 & 0x300000) == 0) {
    Kernel::Clause::computeColor(cl);
    uVar6 = (uint)*(undefined8 *)&cl->field_0x38;
  }
  this->_color = uVar6 >> 0x14 & COLOR_INVALID;
  (this->_premises)._size = 0;
  (this->_premises)._capacity = 0;
  (this->_premises)._array = (Clause **)0x0;
  (this->_lits)._capacity = 0;
  (this->_lits)._stack = (Literal **)0x0;
  (this->_lits)._cursor = (Literal **)0x0;
  (this->_lits)._end = (Literal **)0x0;
  this->_parent = parent;
  uVar7 = *(ulong *)&cl->field_0x38;
  if (*(int *)(Lib::env + 0x8898) == 2) {
    pLVar2 = Kernel::Clause::getAnswerLiteral(cl);
  }
  else {
    pLVar2 = (Literal *)0x0;
  }
  uVar9 = (uint)uVar7;
  uVar6 = uVar9 & 0xfffff;
  this->_ansLit = pLVar2;
  this->_mustResolveAll = uVar6 < (pLVar2 == (Literal *)0x0 ^ 3) || (mustResolveAll || selectedOnly)
  ;
  uVar6 = uVar6 - (pLVar2 != (Literal *)0x0);
  s = (ulong)uVar6;
  Lib::DArray<Kernel::Clause_*>::ensure(&this->_premises,s);
  if (uVar6 != 0) {
    ppCVar3 = (this->_premises)._array + s;
    do {
      ppCVar3[-1] = (Clause *)0x0;
      ppCVar3 = ppCVar3 + -1;
    } while (ppCVar3 != (this->_premises)._array);
  }
  Lib::Stack<Kernel::Literal_*>::reserve(&this->_lits,s);
  if ((uVar7 & 0xfffff) == 0) {
    bVar10 = true;
  }
  else {
    uVar7 = 0;
    uVar8 = 0;
    do {
      pLVar2 = cl->_literals[uVar7];
      if (pLVar2 != this->_ansLit) {
        ppLVar4 = (this->_lits)._cursor;
        if (ppLVar4 == (this->_lits)._end) {
          Lib::Stack<Kernel::Literal_*>::expand(&this->_lits);
          ppLVar4 = (this->_lits)._cursor;
        }
        *ppLVar4 = pLVar2;
        ppLVar4 = (this->_lits)._cursor;
        (this->_lits)._cursor = ppLVar4 + 1;
        pLVar2 = *ppLVar4;
        iVar1 = 0;
        if (*(int *)&(pLVar2->super_Term).field_0xc < 0) {
          iVar1 = 0;
          do {
            pLVar2 = *(Literal **)&(pLVar2->super_Term).field_9._vars;
            if (((ulong)pLVar2 & 1) != 0) {
              uVar5 = 3;
              goto LAB_00514f7e;
            }
            iVar1 = iVar1 + 2;
          } while (*(int *)&(pLVar2->super_Term).field_0xc < 0);
        }
        uVar5 = (pLVar2->super_Term).field_9._vars;
LAB_00514f7e:
        uVar8 = uVar8 + (iVar1 + uVar5 != 0);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != (uVar9 & 0xfffff));
    bVar10 = uVar8 < 2;
  }
  this->_atMostOneNonGround = bVar10;
  if (selectedOnly) {
    uVar6 = *(uint *)&cl->field_0x3c & 0xfffff;
  }
  this->_activeLength = uVar6;
  return;
}

Assistant:

Item(Clause* cl, bool selectedOnly, URResolution& parent, bool mustResolveAll)
  : _orig(cl), _color(cl->color()), _parent(parent)
  {
    unsigned clen = cl->length();
    bool synthesis = (env.options->questionAnswering() == Options::QuestionAnsweringMode::SYNTHESIS);
    _ansLit = synthesis ? cl->getAnswerLiteral() : nullptr;
    _mustResolveAll = mustResolveAll || (selectedOnly ? true : (clen < 2 + (_ansLit ? 1 : 0)));
    unsigned litslen = clen - (_ansLit ? 1 : 0);
    _premises.init(litslen, 0);
    _lits.reserve(litslen);
    unsigned nonGroundCnt = 0;
    for(unsigned i=0; i<clen; i++) {
      if ((*cl)[i] != _ansLit) {
        _lits.push((*cl)[i]);
        if(!_lits.top()->ground()) nonGroundCnt++;
      }
    }
    _atMostOneNonGround = nonGroundCnt<=1;

    _activeLength = selectedOnly ? cl->numSelected() : litslen;
    ASS_REP2(_activeLength>=litslen-1, cl->toString(), cl->numSelected());
  }